

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O1

void __thiscall
cs::stack_type<cs::domain_type,_std::allocator>::push<>
          (stack_type<cs::domain_type,_std::allocator> *this)

{
  domain_type *this_00;
  error *this_01;
  string local_38;
  
  this_00 = this->m_current;
  if (((long)this_00 - (long)this->m_start >> 5) * -0x5555555555555555 - this->m_size != 0) {
    this->m_current = this_00 + 1;
    domain_type::domain_type(this_00);
    return;
  }
  this_01 = (error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000I","");
  cov::error::error(this_01,&local_38);
  __cxa_throw(this_01,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline void push(ArgsT &&...args)
		{
			if (full())
				throw cov::error("E000I");
			::new(m_current++) T(std::forward<ArgsT>(args)...);
		}